

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

double MeCab::logsumexp(double x,double y,bool flg)

{
  double *pdVar1;
  byte in_DIL;
  double dVar2;
  double in_XMM1_Qa;
  double vmax;
  double vmin;
  double local_18;
  double local_10;
  double local_8;
  
  local_8 = in_XMM1_Qa;
  if ((in_DIL & 1) == 0) {
    pdVar1 = std::min<double>(&local_10,&local_18);
    dVar2 = *pdVar1;
    pdVar1 = std::max<double>(&local_10,&local_18);
    local_8 = *pdVar1;
    if (local_8 <= dVar2 + 50.0) {
      dVar2 = exp(dVar2 - local_8);
      dVar2 = log(dVar2 + 1.0);
      local_8 = local_8 + dVar2;
    }
  }
  return local_8;
}

Assistant:

inline double logsumexp(double x, double y, bool flg) {
#define MINUS_LOG_EPSILON  50

  if (flg) return y;  // init mode
  double vmin = std::min<double>(x, y);
  double vmax = std::max<double>(x, y);
  if (vmax > vmin + MINUS_LOG_EPSILON) {
    return vmax;
  } else {
    return vmax + std::log(std::exp(vmin - vmax) + 1.0);
  }
}